

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_fourcc_equal(ma_uint8 *a,char *b)

{
  bool local_11;
  char *b_local;
  ma_uint8 *a_local;
  
  local_11 = false;
  if ((((uint)*a == (int)*b) && (local_11 = false, (uint)a[1] == (int)b[1])) &&
     (local_11 = false, (uint)a[2] == (int)b[2])) {
    local_11 = (uint)a[3] == (int)b[3];
  }
  return (ma_bool32)local_11;
}

Assistant:

MA_API ma_bool32 ma_dr_wav_fourcc_equal(const ma_uint8* a, const char* b)
{
    return
        a[0] == b[0] &&
        a[1] == b[1] &&
        a[2] == b[2] &&
        a[3] == b[3];
}